

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetachedCoroutine.h
# Opt level: O0

void __thiscall
async_simple::coro::detail::DetachedCoroutine::promise_type::unhandled_exception(promise_type *this)

{
  FILE *__stream;
  undefined8 uVar1;
  undefined1 auVar2 [12];
  exception *e;
  exception_ptr *in_stack_ffffffffffffffb0;
  exception_ptr eVar3;
  undefined1 local_30 [8];
  long *local_28;
  int local_1c;
  undefined8 local_18;
  undefined1 local_10 [16];
  
  std::current_exception();
  auVar2 = std::rethrow_exception((exception_ptr)local_10);
  local_1c = auVar2._8_4_;
  local_18 = auVar2._0_8_;
  std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffffb0);
  if (local_1c == 1) {
    local_28 = (long *)__cxa_begin_catch(local_18);
    __stream = _stderr;
    uVar1 = (**(code **)(*local_28 + 0x10))();
    fprintf(__stream,"find exception %s\n",uVar1);
    fflush(_stderr);
    eVar3._M_exception_object = local_30;
    std::current_exception();
    auVar2 = std::rethrow_exception(eVar3);
    local_1c = auVar2._8_4_;
    local_18 = auVar2._0_8_;
    __cxa_end_catch();
  }
  _Unwind_Resume(local_18);
}

Assistant:

void unhandled_exception() {
            try {
                std::rethrow_exception(std::current_exception());
            } catch (const std::exception& e) {
                fprintf(stderr, "find exception %s\n", e.what());
                fflush(stderr);
                std::rethrow_exception(std::current_exception());
            }
        }